

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_iffeature_free(ly_ctx *ctx,lys_iffeature *iffeature,uint8_t iffeature_size,int shallow,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  byte local_29;
  uint8_t i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  int shallow_local;
  uint8_t iffeature_size_local;
  lys_iffeature *iffeature_local;
  ly_ctx *ctx_local;
  
  for (local_29 = 0; local_29 < iffeature_size; local_29 = local_29 + 1) {
    lys_extension_instances_free
              (ctx,iffeature[local_29].ext,(uint)iffeature[local_29].ext_size,private_destructor);
    if (shallow == 0) {
      free(iffeature[local_29].expr);
      free(iffeature[local_29].features);
    }
  }
  free(iffeature);
  return;
}

Assistant:

API void
lys_iffeature_free(struct ly_ctx *ctx, struct lys_iffeature *iffeature, uint8_t iffeature_size,
                   int shallow, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    uint8_t i;

    for (i = 0; i < iffeature_size; ++i) {
        lys_extension_instances_free(ctx, iffeature[i].ext, iffeature[i].ext_size, private_destructor);
        if (!shallow) {
            free(iffeature[i].expr);
            free(iffeature[i].features);
        }
    }
    free(iffeature);
}